

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O2

void __thiscall skiwi::reg_alloc::make_all_available(reg_alloc *this)

{
  pointer poVar1;
  byte bVar2;
  byte *pbVar3;
  byte local_2d;
  uint local_2c;
  
  bVar2 = 0;
  while( true ) {
    poVar1 = (this->available_registers).
             super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_2d = bVar2;
    if (((uint)(*(int *)&(this->available_registers).
                         super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (int)poVar1) >> 2 & 0xff) <=
        (uint)bVar2) break;
    pbVar3 = std::
             map<assembler::asmcode::operand,_unsigned_char,_std::less<assembler::asmcode::operand>,_std::allocator<std::pair<const_assembler::asmcode::operand,_unsigned_char>_>_>
             ::operator[](&this->register_to_index,poVar1 + bVar2);
    *pbVar3 = bVar2;
    std::
    _Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
    ::_M_insert_unique<unsigned_char_const&>
              ((_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                *)&this->free_registers,&local_2d);
    bVar2 = local_2d + 1;
  }
  for (local_2c = 0; local_2c < this->nr_locals; local_2c = local_2c + 1) {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&this->free_locals,&local_2c);
  }
  return;
}

Assistant:

void reg_alloc::make_all_available()
  {
  for (uint8_t i = 0; i < (uint8_t)available_registers.size(); ++i)
    {
    register_to_index[available_registers[i]] = i;
    free_registers.insert(i);
    }

  for (uint32_t i = 0; i < nr_locals; ++i)
    free_locals.insert(i);
  }